

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_fma_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar82;
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar84 [32];
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b;
  __m256 _outp;
  __m256 _p;
  __m256 _b_avx;
  int i;
  int size;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined8 local_2470;
  undefined8 uStack_2468;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  int local_23d4;
  undefined8 *local_23c0;
  undefined1 (*local_23b0) [32];
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  float local_20c0;
  float fStack_20bc;
  float fStack_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  float fStack_20a8;
  float fStack_20a4;
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  float fStack_2084;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  uint local_d00;
  uint uStack_cfc;
  uint uStack_cf8;
  uint uStack_cf4;
  uint uStack_cf0;
  uint uStack_cec;
  uint uStack_ce8;
  uint uStack_ce4;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  
  local_23d4 = 0;
  uVar1 = *in_RSI;
  auVar13 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x20);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x30);
  auVar14 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x20);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x30);
  uStack_2310 = auVar13._0_8_;
  uStack_2308 = auVar13._8_8_;
  local_23c0 = in_RDX;
  local_23b0 = in_RDI;
  for (; local_23d4 + 7 < in_ECX * in_R8D; local_23d4 = local_23d4 + 8) {
    auVar47._16_8_ = uStack_2310;
    auVar47._0_16_ = auVar14;
    auVar47._24_8_ = uStack_2308;
    auVar46._16_8_ = uStack_2310;
    auVar46._0_16_ = auVar14;
    auVar46._24_8_ = uStack_2308;
    auVar45._16_8_ = uStack_2310;
    auVar45._0_16_ = auVar14;
    auVar45._24_8_ = uStack_2308;
    auVar7._16_8_ = uStack_2310;
    auVar7._0_16_ = auVar14;
    auVar7._24_8_ = uStack_2308;
    auVar13 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x30);
    auVar15 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0),0x30);
    uStack_2050 = auVar15._0_8_;
    uStack_2048 = auVar15._8_8_;
    auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
    auVar16 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x80000000),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x80000000),0x30);
    uStack_2010 = auVar16._0_8_;
    uStack_2008 = auVar16._8_8_;
    auVar16 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x30);
    auVar17 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x40490fdb),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x40490fdb),0x30);
    uStack_1fd0 = auVar17._0_8_;
    uStack_1fc8 = auVar17._8_8_;
    auVar17 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x30);
    auVar18 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3fc90fdb),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3fc90fdb),0x30);
    uStack_1f90 = auVar18._0_8_;
    uStack_1f88 = auVar18._8_8_;
    auVar6._16_8_ = uStack_2050;
    auVar6._0_16_ = auVar13;
    auVar6._24_8_ = uStack_2048;
    auVar6 = vcmpps_avx(auVar7,auVar6,4);
    auVar2._16_8_ = uStack_2050;
    auVar2._0_16_ = auVar13;
    auVar2._24_8_ = uStack_2048;
    auVar7 = vcmpps_avx(*local_23b0,auVar2,4);
    auVar6 = vandps_avx(auVar6,auVar7);
    auVar10._16_8_ = uStack_2010;
    auVar10._0_16_ = auVar15;
    auVar10._24_8_ = uStack_2008;
    auVar2 = vandps_avx(auVar10,auVar45);
    auVar5._16_8_ = uStack_2010;
    auVar5._0_16_ = auVar15;
    auVar5._24_8_ = uStack_2008;
    auVar3 = vandps_avx(auVar5,*local_23b0);
    auVar9._16_8_ = uStack_2050;
    auVar9._0_16_ = auVar13;
    auVar9._24_8_ = uStack_2048;
    auVar8 = vcmpps_avx(auVar46,auVar9,1);
    auVar9 = vcmpps_avx(*local_23b0,auVar9,1);
    auVar4._16_8_ = uStack_2010;
    auVar4._0_16_ = auVar15;
    auVar4._24_8_ = uStack_2008;
    auVar9 = vandps_avx(auVar9,auVar4);
    auVar34._16_8_ = uStack_1fd0;
    auVar34._0_16_ = auVar16;
    auVar34._24_8_ = uStack_1fc8;
    auVar9 = vorps_avx(auVar9,auVar34);
    auVar9 = vandps_avx(auVar8,auVar9);
    auVar12 = vdivps_avx(*local_23b0,auVar47);
    auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
    auVar18 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x30);
    uStack_1790 = auVar18._0_8_;
    uStack_1788 = auVar18._8_8_;
    auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
    auVar19 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x30);
    uStack_1750 = auVar19._0_8_;
    uStack_1748 = auVar19._8_8_;
    auVar19 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x30);
    auVar20 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0xbf800000),0x20);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0xbf800000),0x30);
    uStack_1710 = auVar20._0_8_;
    uStack_1708 = auVar20._8_8_;
    auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
    auVar21 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x20);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x30);
    uStack_16d0 = auVar21._0_8_;
    uStack_16c8 = auVar21._8_8_;
    auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
    auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
    auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
    uStack_1690 = auVar22._0_8_;
    uStack_1688 = auVar22._8_8_;
    auVar22 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x20);
    auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x30);
    auVar23 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x20);
    auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x30);
    uStack_1650 = auVar23._0_8_;
    uStack_1648 = auVar23._8_8_;
    auVar23 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3e4cb974),0x20);
    auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3e4cb974),0x30);
    auVar24 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3e4cb974),0x20);
    auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3e4cb974),0x30);
    uStack_1610 = auVar24._0_8_;
    uStack_1608 = auVar24._8_8_;
    auVar24 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbe117200),0x20);
    auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbe117200),0x30);
    auVar25 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar25 = vinsertps_avx(auVar25,ZEXT416(0xbe117200),0x20);
    auVar25 = vinsertps_avx(auVar25,ZEXT416(0xbe117200),0x30);
    uStack_15d0 = auVar25._0_8_;
    uStack_15c8 = auVar25._8_8_;
    auVar25 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3dd9ed24),0x20);
    auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3dd9ed24),0x30);
    auVar26 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3dd9ed24),0x20);
    auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3dd9ed24),0x30);
    uStack_1590 = auVar26._0_8_;
    uStack_1588 = auVar26._8_8_;
    auVar26 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbd99b01e),0x20);
    auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbd99b01e),0x30);
    auVar27 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbd99b01e),0x20);
    auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbd99b01e),0x30);
    uStack_1550 = auVar27._0_8_;
    uStack_1548 = auVar27._8_8_;
    auVar27 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar27 = vinsertps_avx(auVar27,ZEXT416(0x3d2edd4e),0x20);
    auVar27 = vinsertps_avx(auVar27,ZEXT416(0x3d2edd4e),0x30);
    auVar28 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3d2edd4e),0x20);
    auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3d2edd4e),0x30);
    uStack_1510 = auVar28._0_8_;
    uStack_1508 = auVar28._8_8_;
    auVar28 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbc83a25c),0x20);
    auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbc83a25c),0x30);
    auVar29 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(0xbc83a25c),0x20);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(0xbc83a25c),0x30);
    uStack_14d0 = auVar29._0_8_;
    uStack_14c8 = auVar29._8_8_;
    auVar29 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3b3ac537),0x20);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3b3ac537),0x30);
    auVar30 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3b3ac537),0x20);
    auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3b3ac537),0x30);
    uStack_1490 = auVar30._0_8_;
    uStack_1488 = auVar30._8_8_;
    auVar38._16_8_ = uStack_1790;
    auVar38._0_16_ = auVar15;
    auVar38._24_8_ = uStack_1788;
    auVar8 = vandps_avx(auVar38,auVar12);
    auVar41._16_8_ = uStack_1790;
    auVar41._0_16_ = auVar15;
    auVar41._24_8_ = uStack_1788;
    auVar10 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
    auVar4 = vandnps_avx(auVar41,auVar12);
    auVar35._16_8_ = uStack_1750;
    auVar35._0_16_ = auVar18;
    auVar35._24_8_ = uStack_1748;
    auVar11 = vcmpps_avx(auVar35,auVar4,1);
    auVar37._16_8_ = uStack_1710;
    auVar37._0_16_ = auVar19;
    auVar37._24_8_ = uStack_1708;
    auVar12 = vandps_avx(auVar11,auVar37);
    auVar5 = vandnps_avx(auVar11,auVar4);
    auVar5 = vorps_avx(auVar12,auVar5);
    auVar12 = vandps_avx(auVar11,auVar4);
    auVar40._16_8_ = uStack_1750;
    auVar40._0_16_ = auVar18;
    auVar40._24_8_ = uStack_1748;
    auVar4 = vandnps_avx(auVar11,auVar40);
    auVar12 = vorps_avx(auVar12,auVar4);
    auVar12 = vdivps_avx(auVar5,auVar12);
    local_13c0 = auVar12._0_4_;
    fStack_13bc = auVar12._4_4_;
    fStack_13b8 = auVar12._8_4_;
    fStack_13b4 = auVar12._12_4_;
    fStack_13b0 = auVar12._16_4_;
    fStack_13ac = auVar12._20_4_;
    fStack_13a8 = auVar12._24_4_;
    fStack_13a4 = auVar12._28_4_;
    fVar82 = local_13c0 * local_13c0;
    fVar85 = fStack_13bc * fStack_13bc;
    fVar87 = fStack_13b8 * fStack_13b8;
    fVar89 = fStack_13b4 * fStack_13b4;
    fVar91 = fStack_13b0 * fStack_13b0;
    fVar93 = fStack_13ac * fStack_13ac;
    fVar95 = fStack_13a8 * fStack_13a8;
    fVar83 = fVar82 * fVar82;
    fVar86 = fVar85 * fVar85;
    fVar88 = fVar87 * fVar87;
    fVar90 = fVar89 * fVar89;
    fVar92 = fVar91 * fVar91;
    fVar94 = fVar93 * fVar93;
    fVar96 = fVar95 * fVar95;
    auVar48._4_4_ = fVar86;
    auVar48._0_4_ = fVar83;
    auVar48._8_4_ = fVar88;
    auVar48._12_4_ = fVar90;
    auVar48._16_4_ = fVar92;
    auVar48._20_4_ = fVar94;
    auVar48._24_4_ = fVar96;
    auVar48._28_4_ = fStack_13a4;
    auVar57._16_8_ = uStack_14d0;
    auVar57._0_16_ = auVar28;
    auVar57._24_8_ = uStack_14c8;
    auVar59._16_8_ = uStack_1550;
    auVar59._0_16_ = auVar26;
    auVar59._24_8_ = uStack_1548;
    auVar15 = vfmadd213ps_fma(auVar57,auVar48,auVar59);
    auVar49._4_4_ = fVar86;
    auVar49._0_4_ = fVar83;
    auVar49._8_4_ = fVar88;
    auVar49._12_4_ = fVar90;
    auVar49._16_4_ = fVar92;
    auVar49._20_4_ = fVar94;
    auVar49._24_4_ = fVar96;
    auVar49._28_4_ = fStack_13a4;
    auVar61._16_8_ = uStack_15d0;
    auVar61._0_16_ = auVar24;
    auVar61._24_8_ = uStack_15c8;
    auVar15 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar49,auVar61);
    auVar50._4_4_ = fVar86;
    auVar50._0_4_ = fVar83;
    auVar50._8_4_ = fVar88;
    auVar50._12_4_ = fVar90;
    auVar50._16_4_ = fVar92;
    auVar50._20_4_ = fVar94;
    auVar50._24_4_ = fVar96;
    auVar50._28_4_ = fStack_13a4;
    auVar63._16_8_ = uStack_1650;
    auVar63._0_16_ = auVar22;
    auVar63._24_8_ = uStack_1648;
    auVar15 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar50,auVar63);
    auVar51._4_4_ = fVar86;
    auVar51._0_4_ = fVar83;
    auVar51._8_4_ = fVar88;
    auVar51._12_4_ = fVar90;
    auVar51._16_4_ = fVar92;
    auVar51._20_4_ = fVar94;
    auVar51._24_4_ = fVar96;
    auVar51._28_4_ = fStack_13a4;
    auVar56._16_8_ = uStack_1490;
    auVar56._0_16_ = auVar29;
    auVar56._24_8_ = uStack_1488;
    auVar58._16_8_ = uStack_1510;
    auVar58._0_16_ = auVar27;
    auVar58._24_8_ = uStack_1508;
    auVar18 = vfmadd213ps_fma(auVar56,auVar51,auVar58);
    auVar52._4_4_ = fVar86;
    auVar52._0_4_ = fVar83;
    auVar52._8_4_ = fVar88;
    auVar52._12_4_ = fVar90;
    auVar52._16_4_ = fVar92;
    auVar52._20_4_ = fVar94;
    auVar52._24_4_ = fVar96;
    auVar52._28_4_ = fStack_13a4;
    auVar60._16_8_ = uStack_1590;
    auVar60._0_16_ = auVar25;
    auVar60._24_8_ = uStack_1588;
    auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar52,auVar60);
    auVar53._4_4_ = fVar86;
    auVar53._0_4_ = fVar83;
    auVar53._8_4_ = fVar88;
    auVar53._12_4_ = fVar90;
    auVar53._16_4_ = fVar92;
    auVar53._20_4_ = fVar94;
    auVar53._24_4_ = fVar96;
    auVar53._28_4_ = fStack_13a4;
    auVar62._16_8_ = uStack_1610;
    auVar62._0_16_ = auVar23;
    auVar62._24_8_ = uStack_1608;
    auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar53,auVar62);
    auVar54._4_4_ = fVar86;
    auVar54._0_4_ = fVar83;
    auVar54._8_4_ = fVar88;
    auVar54._12_4_ = fVar90;
    auVar54._16_4_ = fVar92;
    auVar54._20_4_ = fVar94;
    auVar54._24_4_ = fVar96;
    auVar54._28_4_ = fStack_13a4;
    auVar64._16_8_ = uStack_1690;
    auVar64._0_16_ = auVar21;
    auVar64._24_8_ = uStack_1688;
    auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar54,auVar64);
    auVar55._4_4_ = fVar85;
    auVar55._0_4_ = fVar82;
    auVar55._8_4_ = fVar87;
    auVar55._12_4_ = fVar89;
    auVar55._16_4_ = fVar91;
    auVar55._20_4_ = fVar93;
    auVar55._24_4_ = fVar95;
    auVar55._28_4_ = fStack_13a4;
    auVar15 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar55,ZEXT1632(auVar18));
    local_1440 = auVar15._0_4_;
    fStack_143c = auVar15._4_4_;
    fStack_1438 = auVar15._8_4_;
    fStack_1434 = auVar15._12_4_;
    auVar36._16_8_ = uStack_16d0;
    auVar36._0_16_ = auVar20;
    auVar36._24_8_ = uStack_16c8;
    auVar12 = vandps_avx(auVar11,auVar36);
    local_1820 = auVar12._0_4_;
    fStack_181c = auVar12._4_4_;
    fStack_1818 = auVar12._8_4_;
    fStack_1814 = auVar12._12_4_;
    fStack_1810 = auVar12._16_4_;
    fStack_180c = auVar12._20_4_;
    fStack_1808 = auVar12._24_4_;
    fStack_1804 = auVar12._28_4_;
    auVar39._4_4_ = fStack_143c * fStack_13bc + fStack_181c;
    auVar39._0_4_ = local_1440 * local_13c0 + local_1820;
    auVar39._8_4_ = fStack_1438 * fStack_13b8 + fStack_1818;
    auVar39._12_4_ = fStack_1434 * fStack_13b4 + fStack_1814;
    auVar39._16_4_ = fStack_13b0 * 0.0 + fStack_1810;
    auVar39._20_4_ = fStack_13ac * 0.0 + fStack_180c;
    auVar39._24_4_ = fStack_13a8 * 0.0 + fStack_1808;
    auVar39._28_4_ = fStack_13a4 + fStack_1804;
    auVar8 = vorps_avx(auVar39,auVar8);
    local_20a0 = auVar8._0_4_;
    fStack_209c = auVar8._4_4_;
    fStack_2098 = auVar8._8_4_;
    fStack_2094 = auVar8._12_4_;
    fStack_2090 = auVar8._16_4_;
    fStack_208c = auVar8._20_4_;
    fStack_2088 = auVar8._24_4_;
    fStack_2084 = auVar8._28_4_;
    local_20c0 = auVar9._0_4_;
    fStack_20bc = auVar9._4_4_;
    fStack_20b8 = auVar9._8_4_;
    fStack_20b4 = auVar9._12_4_;
    fStack_20b0 = auVar9._16_4_;
    fStack_20ac = auVar9._20_4_;
    fStack_20a8 = auVar9._24_4_;
    fStack_20a4 = auVar9._28_4_;
    auVar33._16_8_ = uStack_1fd0;
    auVar33._0_16_ = auVar16;
    auVar33._24_8_ = uStack_1fc8;
    auVar2 = vorps_avx(auVar2,auVar33);
    auVar8._16_8_ = uStack_2050;
    auVar8._0_16_ = auVar13;
    auVar8._24_8_ = uStack_2048;
    auVar9 = vcmpps_avx(auVar2,auVar8,1);
    auVar11._16_8_ = uStack_1f90;
    auVar11._0_16_ = auVar17;
    auVar11._24_8_ = uStack_1f88;
    auVar2 = vorps_avx(auVar3,auVar11);
    auVar2 = vandps_avx(auVar7,auVar2);
    auVar3._16_8_ = uStack_1fd0;
    auVar3._0_16_ = auVar16;
    auVar3._24_8_ = uStack_1fc8;
    auVar3 = vandps_avx(auVar9,auVar3);
    auVar42._16_8_ = uStack_2050;
    auVar42._0_16_ = auVar13;
    auVar42._24_8_ = uStack_2048;
    auVar9 = vandnps_avx(auVar9,auVar42);
    auVar3 = vorps_avx(auVar3,auVar9);
    auVar3 = vandnps_avx(auVar7,auVar3);
    auVar3 = vorps_avx(auVar2,auVar3);
    auVar12._4_4_ = fStack_209c + fStack_20bc;
    auVar12._0_4_ = local_20a0 + local_20c0;
    auVar12._12_4_ = fStack_2094 + fStack_20b4;
    auVar12._8_4_ = fStack_2098 + fStack_20b8;
    auVar12._20_4_ = fStack_208c + fStack_20ac;
    auVar12._16_4_ = fStack_2090 + fStack_20b0;
    auVar12._28_4_ = fStack_2084 + fStack_20a4;
    auVar12._24_4_ = fStack_2088 + fStack_20a8;
    auVar2 = vandps_avx(auVar6,auVar12);
    local_d00 = auVar6._0_4_;
    uStack_cfc = auVar6._4_4_;
    uStack_cf8 = auVar6._8_4_;
    uStack_cf4 = auVar6._12_4_;
    uStack_cf0 = auVar6._16_4_;
    uStack_cec = auVar6._20_4_;
    uStack_ce8 = auVar6._24_4_;
    uStack_ce4 = auVar6._28_4_;
    auVar84._0_4_ = local_d00 ^ auVar10._0_4_;
    auVar84._4_4_ = uStack_cfc ^ auVar10._4_4_;
    auVar84._8_4_ = uStack_cf8 ^ auVar10._8_4_;
    auVar84._12_4_ = uStack_cf4 ^ auVar10._12_4_;
    auVar84._16_4_ = uStack_cf0 ^ auVar10._16_4_;
    auVar84._20_4_ = uStack_cec ^ auVar10._20_4_;
    auVar84._24_4_ = uStack_ce8 ^ auVar10._24_4_;
    auVar84._28_4_ = uStack_ce4 ^ auVar10._28_4_;
    auVar6 = vandps_avx(auVar84,auVar3);
    auVar6 = vorps_avx(auVar2,auVar6);
    local_2440 = auVar6._0_8_;
    uStack_2438 = auVar6._8_8_;
    uStack_2430 = auVar6._16_8_;
    uStack_2428 = auVar6._24_8_;
    *local_23c0 = local_2440;
    local_23c0[1] = uStack_2438;
    local_23c0[2] = uStack_2430;
    local_23c0[3] = uStack_2428;
    local_23b0 = local_23b0 + 1;
    local_23c0 = local_23c0 + 4;
  }
  uVar1 = *in_RSI;
  uVar31 = CONCAT44(uVar1,uVar1);
  uVar32 = CONCAT44(uVar1,uVar1);
  for (; local_23d4 + 3 < in_ECX * in_R8D; local_23d4 = local_23d4 + 4) {
    auVar44._8_8_ = uVar32;
    auVar44._0_8_ = uVar31;
    auVar43._8_8_ = uVar32;
    auVar43._0_8_ = uVar31;
    auVar30._8_8_ = uVar32;
    auVar30._0_8_ = uVar31;
    auVar14._8_8_ = uVar32;
    auVar14._0_8_ = uVar31;
    auVar13 = vcmpps_avx(auVar14,ZEXT816(0),4);
    auVar14 = vcmpps_avx(*(undefined1 (*) [16])*local_23b0,ZEXT816(0),4);
    auVar16 = vpand_avx(auVar13,auVar14);
    auVar18._8_8_ = 0x8000000080000000;
    auVar18._0_8_ = 0x8000000080000000;
    auVar17 = vpand_avx(auVar18,auVar30);
    auVar15._8_8_ = 0x8000000080000000;
    auVar15._0_8_ = 0x8000000080000000;
    auVar18 = vpand_avx(auVar15,*(undefined1 (*) [16])*local_23b0);
    auVar13 = vcmpps_avx(auVar43,ZEXT816(0),1);
    auVar15 = vcmpps_avx(*(undefined1 (*) [16])*local_23b0,ZEXT816(0),1);
    auVar19._8_8_ = 0x8000000080000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar15 = vpand_avx(auVar15,auVar19);
    auVar22._8_8_ = 0x40490fdb40490fdb;
    auVar22._0_8_ = 0x40490fdb40490fdb;
    auVar15 = vpor_avx(auVar15,auVar22);
    auVar19 = vpand_avx(auVar13,auVar15);
    auVar13 = vdivps_avx(*(undefined1 (*) [16])*local_23b0,auVar44);
    auVar23._8_8_ = 0x8000000080000000;
    auVar23._0_8_ = 0x8000000080000000;
    auVar20 = vpand_avx(auVar23,auVar13);
    auVar29._8_8_ = 0x8000000080000000;
    auVar29._0_8_ = 0x8000000080000000;
    auVar23 = vpcmpeqd_avx(auVar22,auVar22);
    auVar21 = vpandn_avx(auVar29,auVar13);
    auVar27._8_8_ = 0x3f8000003f800000;
    auVar27._0_8_ = 0x3f8000003f800000;
    auVar13 = vcmpps_avx(auVar27,auVar21,1);
    auVar25._8_8_ = 0xbf800000bf800000;
    auVar25._0_8_ = 0xbf800000bf800000;
    auVar15 = vpand_avx(auVar13,auVar25);
    auVar22 = vpandn_avx(auVar13,auVar21);
    auVar22 = vpor_avx(auVar15,auVar22);
    auVar15 = vpand_avx(auVar13,auVar21);
    auVar28._8_8_ = 0x3f8000003f800000;
    auVar28._0_8_ = 0x3f8000003f800000;
    auVar21 = vpandn_avx(auVar13,auVar28);
    auVar15 = vpor_avx(auVar15,auVar21);
    auVar15 = vdivps_avx(auVar22,auVar15);
    local_610 = auVar15._0_4_;
    fStack_60c = auVar15._4_4_;
    fStack_608 = auVar15._8_4_;
    fStack_604 = auVar15._12_4_;
    fVar82 = local_610 * local_610;
    fVar85 = fStack_60c * fStack_60c;
    fVar87 = fStack_608 * fStack_608;
    fVar89 = fStack_604 * fStack_604;
    fVar83 = fVar82 * fVar82;
    fVar86 = fVar85 * fVar85;
    fVar88 = fVar87 * fVar87;
    fVar90 = fVar89 * fVar89;
    auVar65._4_4_ = fVar86;
    auVar65._0_4_ = fVar83;
    auVar65._8_4_ = fVar88;
    auVar65._12_4_ = fVar90;
    auVar74._8_8_ = 0xbc83a25cbc83a25c;
    auVar74._0_8_ = 0xbc83a25cbc83a25c;
    auVar76._8_8_ = 0xbd99b01ebd99b01e;
    auVar76._0_8_ = 0xbd99b01ebd99b01e;
    auVar15 = vfmadd213ps_fma(auVar74,auVar65,auVar76);
    auVar66._4_4_ = fVar86;
    auVar66._0_4_ = fVar83;
    auVar66._8_4_ = fVar88;
    auVar66._12_4_ = fVar90;
    auVar78._8_8_ = 0xbe117200be117200;
    auVar78._0_8_ = 0xbe117200be117200;
    auVar15 = vfmadd213ps_fma(auVar15,auVar66,auVar78);
    auVar67._4_4_ = fVar86;
    auVar67._0_4_ = fVar83;
    auVar67._8_4_ = fVar88;
    auVar67._12_4_ = fVar90;
    auVar80._8_8_ = 0xbeaaaa53beaaaa53;
    auVar80._0_8_ = 0xbeaaaa53beaaaa53;
    auVar15 = vfmadd213ps_fma(auVar15,auVar67,auVar80);
    auVar68._4_4_ = fVar86;
    auVar68._0_4_ = fVar83;
    auVar68._8_4_ = fVar88;
    auVar68._12_4_ = fVar90;
    auVar73._8_8_ = 0x3b3ac5373b3ac537;
    auVar73._0_8_ = 0x3b3ac5373b3ac537;
    auVar75._8_8_ = 0x3d2edd4e3d2edd4e;
    auVar75._0_8_ = 0x3d2edd4e3d2edd4e;
    auVar21 = vfmadd213ps_fma(auVar73,auVar68,auVar75);
    auVar69._4_4_ = fVar86;
    auVar69._0_4_ = fVar83;
    auVar69._8_4_ = fVar88;
    auVar69._12_4_ = fVar90;
    auVar77._8_8_ = 0x3dd9ed243dd9ed24;
    auVar77._0_8_ = 0x3dd9ed243dd9ed24;
    auVar21 = vfmadd213ps_fma(auVar21,auVar69,auVar77);
    auVar70._4_4_ = fVar86;
    auVar70._0_4_ = fVar83;
    auVar70._8_4_ = fVar88;
    auVar70._12_4_ = fVar90;
    auVar79._8_8_ = 0x3e4cb9743e4cb974;
    auVar79._0_8_ = 0x3e4cb9743e4cb974;
    auVar21 = vfmadd213ps_fma(auVar21,auVar70,auVar79);
    auVar71._4_4_ = fVar86;
    auVar71._0_4_ = fVar83;
    auVar71._8_4_ = fVar88;
    auVar71._12_4_ = fVar90;
    auVar81._8_8_ = 0x3f8000003f800000;
    auVar81._0_8_ = 0x3f8000003f800000;
    auVar21 = vfmadd213ps_fma(auVar21,auVar71,auVar81);
    auVar72._4_4_ = fVar85;
    auVar72._0_4_ = fVar82;
    auVar72._8_4_ = fVar87;
    auVar72._12_4_ = fVar89;
    auVar15 = vfmadd213ps_fma(auVar15,auVar72,auVar21);
    local_650 = auVar15._0_4_;
    fStack_64c = auVar15._4_4_;
    fStack_648 = auVar15._8_4_;
    fStack_644 = auVar15._12_4_;
    auVar24._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar24._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar13 = vpand_avx(auVar13,auVar24);
    local_680 = auVar13._0_4_;
    fStack_67c = auVar13._4_4_;
    fStack_678 = auVar13._8_4_;
    fStack_674 = auVar13._12_4_;
    auVar26._4_4_ = fStack_64c * fStack_60c + fStack_67c;
    auVar26._0_4_ = local_650 * local_610 + local_680;
    auVar26._8_4_ = fStack_648 * fStack_608 + fStack_678;
    auVar26._12_4_ = fStack_644 * fStack_604 + fStack_674;
    auVar13 = vpor_avx(auVar26,auVar20);
    local_b60 = auVar13._0_4_;
    fStack_b5c = auVar13._4_4_;
    fStack_b58 = auVar13._8_4_;
    fStack_b54 = auVar13._12_4_;
    local_b70 = auVar19._0_4_;
    fStack_b6c = auVar19._4_4_;
    fStack_b68 = auVar19._8_4_;
    fStack_b64 = auVar19._12_4_;
    auVar21._8_8_ = 0x40490fdb40490fdb;
    auVar21._0_8_ = 0x40490fdb40490fdb;
    auVar13 = vpor_avx(auVar17,auVar21);
    auVar13 = vcmpps_avx(auVar13,ZEXT816(0),1);
    auVar20._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar20._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar15 = vpor_avx(auVar18,auVar20);
    auVar15 = vpand_avx(auVar14,auVar15);
    auVar17._8_8_ = 0x40490fdb40490fdb;
    auVar17._0_8_ = 0x40490fdb40490fdb;
    auVar17 = vpand_avx(auVar13,auVar17);
    auVar13 = vpandn_avx(auVar13,ZEXT816(0));
    auVar13 = vpor_avx(auVar17,auVar13);
    auVar13 = vpandn_avx(auVar14,auVar13);
    auVar14 = vpor_avx(auVar15,auVar13);
    auVar13._4_4_ = fStack_b5c + fStack_b6c;
    auVar13._0_4_ = local_b60 + local_b70;
    auVar13._12_4_ = fStack_b54 + fStack_b64;
    auVar13._8_4_ = fStack_b58 + fStack_b68;
    auVar13 = vpand_avx(auVar16,auVar13);
    auVar14 = vpand_avx(auVar16 ^ auVar23,auVar14);
    auVar13 = vpor_avx(auVar13,auVar14);
    local_2470 = auVar13._0_8_;
    uStack_2468 = auVar13._8_8_;
    *local_23c0 = local_2470;
    local_23c0[1] = uStack_2468;
    local_23b0 = (undefined1 (*) [32])(*local_23b0 + 0x10);
    local_23c0 = local_23c0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}